

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended-kalman-filter.cpp
# Opt level: O0

Amatrix * __thiscall
stateObservation::ExtendedKalmanFilter::getAMatrixFD
          (Amatrix *__return_storage_ptr__,ExtendedKalmanFilter *this,StateVector *dx)

{
  double dVar1;
  Scalar SVar2;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other;
  CoeffReturnType pdVar3;
  Scalar *pSVar4;
  Scalar *pSVar5;
  IndexedMatrix *this_00;
  StateVector *pSVar6;
  Matrix<double,__1,__1,_0,__1,__1> local_f0;
  Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true> local_d8 [56];
  Matrix<double,__1,_1,_0,__1,_1> local_a0;
  uint local_8c;
  undefined1 local_88 [4];
  uint i;
  Matrix<double,__1,__1,_0,__1,__1> local_68;
  Matrix<double,__1,_1,_0,__1,_1> local_50;
  Amatrix local_40;
  uint local_24;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *pDStack_20;
  uint k;
  StateVector *dx_local;
  ExtendedKalmanFilter *this_local;
  
  this_00 = &(this->super_KalmanFilterBase).super_ZeroDelayObserver.x_;
  pDStack_20 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)dx;
  dx_local = (StateVector *)this;
  this_local = (ExtendedKalmanFilter *)__return_storage_ptr__;
  local_24 = IndexedMatrix::getTime(this_00);
  KalmanFilterBase::getAmatrixZero(&local_40,&this->super_KalmanFilterBase);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&(this->opt).a_,&local_40);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_40);
  (*(this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase._vptr_ObserverBase
    [0x35])(&local_50,this,(ulong)(local_24 + 1));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=(&(this->opt).xbar_,&local_50);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_50);
  IndexedMatrix::operator()((Matrix *)&local_68,this_00);
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,_1,1,0,_1,1> *)&(this->opt).x_,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_68);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_68);
  if ((this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase.p_ != 0) {
    if ((this->directInputStateProcessFeedthrough_ & 1U) == 0) {
      (*(this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase._vptr_ObserverBase
        [0x1a])(local_88);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
                (&(this->opt).u_,(Matrix<double,__1,_1,_0,__1,_1> *)local_88);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_88);
    }
    else {
      other = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
              IndexedMatrixArray::operator[]
                        (&(this->super_KalmanFilterBase).super_ZeroDelayObserver.u_,local_24);
      Eigen::Matrix<double,-1,1,0,-1,1>::operator=((Matrix<double,_1,1,0,_1,1> *)&this->opt,other);
    }
  }
  for (local_8c = 0;
      local_8c < (this->super_KalmanFilterBase).super_ZeroDelayObserver.super_ObserverBase.n_;
      local_8c = local_8c + 1) {
    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       (pDStack_20,(ulong)local_8c);
    dVar1 = *pdVar3;
    pSVar6 = &(this->opt).x_;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pSVar6,
                        (ulong)local_8c);
    *pSVar4 = *pSVar4 + dVar1;
    (*this->f_->_vptr_DynamicalSystemFunctorBase[2])
              (&local_a0,this->f_,pSVar6,&this->opt,(ulong)local_24);
    pSVar6 = &(this->opt).xp_;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=(pSVar6,&local_a0);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_a0);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-=
              ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)pSVar6,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&(this->opt).xbar_);
    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                       (pDStack_20,(ulong)local_8c);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)pSVar6,pdVar3);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              ((ColXpr *)local_d8,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&(this->opt).a_,
               (ulong)local_8c);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              (local_d8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)pSVar6);
    IndexedMatrix::operator()
              ((Matrix *)&local_f0,&(this->super_KalmanFilterBase).super_ZeroDelayObserver.x_);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_f0,
                        (ulong)local_8c,0);
    SVar2 = *pSVar5;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        &(this->opt).x_,(ulong)local_8c);
    *pSVar4 = SVar2;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_f0);
  }
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(__return_storage_ptr__,&(this->opt).a_);
  return __return_storage_ptr__;
}

Assistant:

KalmanFilterBase::Amatrix// ExtendedKalmanFilter<n,m,p>::Amatrix does not work
    ExtendedKalmanFilter::getAMatrixFD(const ObserverBase::StateVector
                                       &dx)
    {
        unsigned k=this->x_.getTime();
        opt.a_=getAmatrixZero();
        opt.xbar_=prediction_(k+1);
        opt.x_=this->x_();

        if (p_>0)
        {
            if (directInputStateProcessFeedthrough_)
                opt.u_=this->u_[k];
            else
                opt.u_=inputVectorZero();
        }

        for (unsigned i=0;i<n_;++i)
        {
            opt.x_[i]+=dx[i];
            opt.xp_=f_->stateDynamics(opt.x_,opt.u_,k);

            opt.xp_-=opt.xbar_;
            opt.xp_/=dx[i];

            opt.a_.col(i)=opt.xp_;
            opt.x_[i]=this->x_()(i,0);
        }

        return opt.a_;
    }